

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FieldAccessStats::Add(FieldAccessStats *this,FieldAccessStats *other)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (other == (FieldAccessStats *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x39,"(other != nullptr)","other != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->totalInlineCacheCount = this->totalInlineCacheCount + other->totalInlineCacheCount;
  this->noInfoInlineCacheCount = this->noInfoInlineCacheCount + other->noInfoInlineCacheCount;
  this->monoInlineCacheCount = this->monoInlineCacheCount + other->monoInlineCacheCount;
  this->emptyMonoInlineCacheCount =
       this->emptyMonoInlineCacheCount + other->emptyMonoInlineCacheCount;
  this->polyInlineCacheCount = this->polyInlineCacheCount + other->polyInlineCacheCount;
  this->nullPolyInlineCacheCount = this->nullPolyInlineCacheCount + other->nullPolyInlineCacheCount;
  this->emptyPolyInlineCacheCount =
       this->emptyPolyInlineCacheCount + other->emptyPolyInlineCacheCount;
  this->ignoredPolyInlineCacheCount =
       this->ignoredPolyInlineCacheCount + other->ignoredPolyInlineCacheCount;
  this->highUtilPolyInlineCacheCount =
       this->highUtilPolyInlineCacheCount + other->highUtilPolyInlineCacheCount;
  this->lowUtilPolyInlineCacheCount =
       this->lowUtilPolyInlineCacheCount + other->lowUtilPolyInlineCacheCount;
  this->equivPolyInlineCacheCount =
       this->equivPolyInlineCacheCount + other->equivPolyInlineCacheCount;
  this->nonEquivPolyInlineCacheCount =
       this->nonEquivPolyInlineCacheCount + other->nonEquivPolyInlineCacheCount;
  this->disabledPolyInlineCacheCount =
       this->disabledPolyInlineCacheCount + other->disabledPolyInlineCacheCount;
  this->clonedMonoInlineCacheCount =
       this->clonedMonoInlineCacheCount + other->clonedMonoInlineCacheCount;
  this->clonedPolyInlineCacheCount =
       this->clonedPolyInlineCacheCount + other->clonedPolyInlineCacheCount;
  return;
}

Assistant:

void FieldAccessStats::Add(FieldAccessStats* other)
    {
        Assert(other != nullptr);
        this->totalInlineCacheCount += other->totalInlineCacheCount;
        this->noInfoInlineCacheCount += other->noInfoInlineCacheCount;
        this->monoInlineCacheCount += other->monoInlineCacheCount;
        this->emptyMonoInlineCacheCount += other->emptyMonoInlineCacheCount;
        this->polyInlineCacheCount += other->polyInlineCacheCount;
        this->nullPolyInlineCacheCount += other->nullPolyInlineCacheCount;
        this->emptyPolyInlineCacheCount += other->emptyPolyInlineCacheCount;
        this->ignoredPolyInlineCacheCount += other->ignoredPolyInlineCacheCount;
        this->highUtilPolyInlineCacheCount += other->highUtilPolyInlineCacheCount;
        this->lowUtilPolyInlineCacheCount += other->lowUtilPolyInlineCacheCount;
        this->equivPolyInlineCacheCount += other->equivPolyInlineCacheCount;
        this->nonEquivPolyInlineCacheCount += other->nonEquivPolyInlineCacheCount;
        this->disabledPolyInlineCacheCount += other->disabledPolyInlineCacheCount;
        this->clonedMonoInlineCacheCount += other->clonedMonoInlineCacheCount;
        this->clonedPolyInlineCacheCount += other->clonedPolyInlineCacheCount;
    }